

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O0

_Bool effect_handler_TIMED_INC_NO_RES(effect_handler_context_t_conflict *context)

{
  byte local_2d;
  byte local_25;
  wchar_t local_24;
  wchar_t amount;
  effect_handler_context_t_conflict *context_local;
  
  local_24 = effect_calculate_value(context,false);
  if ((player->timed[context->subtype] == 0) || (context->other == 0)) {
    if (local_24 < L'\0') {
      local_24 = L'\0';
    }
    local_25 = 1;
    if ((context->origin).what == SRC_PLAYER) {
      local_25 = context->aware ^ 0xff;
    }
    player_inc_timed(player,context->subtype,local_24,true,(_Bool)(local_25 & 1),false);
  }
  else {
    local_2d = 1;
    if ((context->origin).what == SRC_PLAYER) {
      local_2d = context->aware ^ 0xff;
    }
    player_inc_timed(player,context->subtype,context->other,true,(_Bool)(local_2d & 1),false);
  }
  context->ident = true;
  return true;
}

Assistant:

bool effect_handler_TIMED_INC_NO_RES(effect_handler_context_t *context)
{
	int amount = effect_calculate_value(context, false);

	if (!player->timed[context->subtype] || !context->other)
		player_inc_timed(player, context->subtype, MAX(amount, 0),
			true,
			context->origin.what != SRC_PLAYER || !context->aware,
			false);
	else
		player_inc_timed(player, context->subtype, context->other, true,
			context->origin.what != SRC_PLAYER || !context->aware,
			false);
	context->ident = true;
	return true;
}